

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O2

ClipType __thiscall QRasterPaintEngine::clipType(QRasterPaintEngine *this)

{
  ClipType CVar1;
  QClipData *pQVar2;
  
  pQVar2 = QRasterPaintEnginePrivate::clip
                     ((QRasterPaintEnginePrivate *)
                      (this->super_QPaintEngineEx).super_QPaintEngine.d_ptr.d);
  if (pQVar2 == (QClipData *)0x0) {
    CVar1 = RectClip;
  }
  else {
    CVar1 = (ClipType)((pQVar2->field_0x48 & 2) == 0);
  }
  return CVar1;
}

Assistant:

QRasterPaintEngine::ClipType QRasterPaintEngine::clipType() const
{
    Q_D(const QRasterPaintEngine);

    const QClipData *clip = d->clip();
    if (!clip || clip->hasRectClip)
        return RectClip;
    else
        return ComplexClip;
}